

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_repeated_message_field.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::csharp::RepeatedMessageFieldGenerator::GenerateExtensionCode
          (RepeatedMessageFieldGenerator *this,Printer *printer)

{
  FieldDescriptor *pFVar1;
  bool bVar2;
  Options *pOVar3;
  WrapperFieldGenerator *this_00;
  string_view text;
  string_view text_00;
  
  pOVar3 = SourceGeneratorBase::options((SourceGeneratorBase *)this);
  WritePropertyDocComment(printer,pOVar3,(this->super_FieldGeneratorBase).descriptor_);
  FieldGeneratorBase::AddDeprecatedFlag(&this->super_FieldGeneratorBase,printer);
  text_00._M_str =
       "$access_level$ static readonly pb::RepeatedExtension<$extended_type$, $type_name$> $property_name$ =\n  new pb::RepeatedExtension<$extended_type$, $type_name$>($number$, "
  ;
  text_00._M_len = 0xa9;
  io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (printer,&(this->super_FieldGeneratorBase).variables_,text_00);
  bVar2 = IsWrapperType((this->super_FieldGeneratorBase).descriptor_);
  if (bVar2) {
    this_00 = (WrapperFieldGenerator *)operator_new(0x48);
    pFVar1 = (this->super_FieldGeneratorBase).descriptor_;
    pOVar3 = SourceGeneratorBase::options((SourceGeneratorBase *)this);
    WrapperFieldGenerator::WrapperFieldGenerator(this_00,pFVar1,-1,pOVar3);
    (*(this_00->super_FieldGeneratorBase).super_SourceGeneratorBase._vptr_SourceGeneratorBase[4])
              (this_00,printer);
  }
  else {
    this_00 = (WrapperFieldGenerator *)operator_new(0x40);
    pFVar1 = (this->super_FieldGeneratorBase).descriptor_;
    pOVar3 = SourceGeneratorBase::options((SourceGeneratorBase *)this);
    MessageFieldGenerator::MessageFieldGenerator((MessageFieldGenerator *)this_00,pFVar1,-1,pOVar3);
    (*(this_00->super_FieldGeneratorBase).super_SourceGeneratorBase._vptr_SourceGeneratorBase[4])
              (this_00,printer);
  }
  (*(this_00->super_FieldGeneratorBase).super_SourceGeneratorBase._vptr_SourceGeneratorBase[1])
            (this_00);
  text._M_str = ");\n";
  text._M_len = 3;
  io::Printer::Print<>(printer,text);
  return;
}

Assistant:

void RepeatedMessageFieldGenerator::GenerateExtensionCode(io::Printer* printer) {
  WritePropertyDocComment(printer, options(), descriptor_);
  AddDeprecatedFlag(printer);
  printer->Print(
    variables_,
    "$access_level$ static readonly pb::RepeatedExtension<$extended_type$, $type_name$> $property_name$ =\n"
    "  new pb::RepeatedExtension<$extended_type$, $type_name$>($number$, ");
  if (IsWrapperType(descriptor_)) {
    std::unique_ptr<FieldGeneratorBase> single_generator(
      new WrapperFieldGenerator(descriptor_, -1, this->options()));
    single_generator->GenerateCodecCode(printer);
  } else {
    std::unique_ptr<FieldGeneratorBase> single_generator(
      new MessageFieldGenerator(descriptor_, -1, this->options()));
    single_generator->GenerateCodecCode(printer);
  }
  printer->Print(");\n");
}